

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::write_int_file(path *filepath,Mesh *mesh,I32 value)

{
  byte bVar1;
  I32 IVar2;
  element_type *this;
  value_type_conflict *pvVar3;
  ostream *poVar4;
  undefined1 local_240 [8];
  ofstream file;
  undefined1 local_30 [28];
  I32 value_local;
  Mesh *mesh_local;
  path *filepath_local;
  
  local_30._20_4_ = value;
  unique0x10000115 = mesh;
  mesh_local = (Mesh *)filepath;
  Omega_h::Mesh::comm((Mesh *)local_30);
  this = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    local_30);
  IVar2 = Comm::rank(this);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_30);
  if (IVar2 == 0) {
    pvVar3 = filesystem::path::c_str((path *)mesh_local);
    std::ofstream::ofstream(local_240,pvVar3,_S_out);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      fail("assertion %s failed at %s +%d\n","file.is_open()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x1d6);
    }
    poVar4 = (ostream *)std::ostream::operator<<(local_240,local_30._20_4_);
    std::operator<<(poVar4,'\n');
    std::ofstream::~ofstream(local_240);
  }
  return;
}

Assistant:

static void write_int_file(
    filesystem::path const& filepath, Mesh* mesh, I32 value) {
  if (mesh->comm()->rank() == 0) {
    std::ofstream file(filepath.c_str());
    OMEGA_H_CHECK(file.is_open());
    file << value << '\n';
  }
}